

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void duckdb::QuantileListOperation<duckdb::interval_t,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  size_type *psVar2;
  size_type sVar3;
  Vector *pVVar4;
  uint64_t uVar5;
  reference q_00;
  unsigned_long *q;
  size_type *psVar6;
  long lVar7;
  idx_t iVar8;
  idx_t n;
  interval_t iVar9;
  Interpolator<true> interp;
  QuantileDirect<duckdb::interval_t> local_89;
  FunctionData *local_88;
  list_entry_t *local_80;
  AggregateFinalizeData *local_78;
  FunctionData *local_70;
  pointer local_68;
  Vector *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
      super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
      super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    pVVar4 = (Vector *)duckdb::ListVector::GetEntry(finalize_data->result);
    uVar5 = duckdb::ListVector::GetListSize(finalize_data->result);
    local_78 = finalize_data;
    duckdb::ListVector::Reserve
              (finalize_data->result,
               (*(long *)(pFVar1 + 0x10) - *(long *)(pFVar1 + 8) >> 3) * 0x4ec4ec4ec4ec4ec5 + uVar5)
    ;
    lVar7 = *(long *)(pVVar4 + 0x20);
    local_68 = (state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
               super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>._M_impl.
               super__Vector_impl_data._M_start;
    target->offset = uVar5;
    psVar6 = *(size_type **)(pFVar1 + 0x20);
    psVar2 = *(size_type **)(pFVar1 + 0x28);
    local_88 = pFVar1;
    local_80 = target;
    local_60 = pVVar4;
    if (psVar6 != psVar2) {
      local_70 = pFVar1 + 8;
      lVar7 = lVar7 + uVar5 * 0x10;
      iVar8 = 0;
      do {
        q_00 = vector<duckdb::QuantileValue,_true>::operator[]
                         ((vector<duckdb::QuantileValue,_true> *)local_70,*psVar6);
        n = (long)(state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
                  super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(state->v).super_vector<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
                  super__Vector_base<duckdb::interval_t,_std::allocator<duckdb::interval_t>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
        local_58.desc = *(bool *)(local_88 + 0x38);
        local_58.FRN = Interpolator<true>::Index(q_00,n);
        local_58.CRN = local_58.FRN;
        local_58.begin = iVar8;
        local_58.end = n;
        iVar9 = Interpolator<true>::
                Operation<duckdb::interval_t,duckdb::interval_t,duckdb::QuantileDirect<duckdb::interval_t>>
                          (&local_58,local_68,local_60,&local_89);
        sVar3 = *psVar6;
        *(long *)(lVar7 + sVar3 * 0x10) = iVar9._0_8_;
        *(int64_t *)(lVar7 + 8 + sVar3 * 0x10) = iVar9.micros;
        psVar6 = psVar6 + 1;
        iVar8 = local_58.FRN;
      } while (psVar6 != psVar2);
    }
    uVar5 = (*(long *)(local_88 + 0x10) - *(long *)(local_88 + 8) >> 3) * 0x4ec4ec4ec4ec4ec5;
    local_80->length = uVar5;
    duckdb::ListVector::SetListSize(local_78->result,uVar5 + local_80->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}